

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<bool>::emplace<bool&>(QPodArrayOps<bool> *this,qsizetype i,bool *args)

{
  bool bVar1;
  Data *pDVar2;
  long lVar3;
  bool *pbVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<bool>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<bool>).size;
    if ((lVar3 == i) &&
       (pbVar4 = (this->super_QArrayDataPointer<bool>).ptr,
       (bool *)(((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) != pbVar4 + i)) {
      pbVar4[i] = *args;
      (this->super_QArrayDataPointer<bool>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (pbVar4 = (this->super_QArrayDataPointer<bool>).ptr,
       (bool *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pbVar4)) {
      pbVar4[-1] = *args;
      (this->super_QArrayDataPointer<bool>).ptr = pbVar4 + -1;
      (this->super_QArrayDataPointer<bool>).size = lVar3 + 1;
      return;
    }
  }
  bVar1 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<bool>).size != 0);
  QArrayDataPointer<bool>::detachAndGrow
            (&this->super_QArrayDataPointer<bool>,where,1,(bool **)0x0,
             (QArrayDataPointer<bool> *)0x0);
  pbVar4 = createHole(this,where,i,1);
  *pbVar4 = bVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }